

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (ExceptionTranslatorRegistry *this,const_iterator it)

{
  bool bVar1;
  reference ppIVar2;
  string *in_RDI;
  vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  *in_stack_ffffffffffffffa0;
  allocator *paVar3;
  allocator local_21;
  IExceptionTranslator **local_20;
  __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
  local_10 [2];
  
  local_20 = (IExceptionTranslator **)
             std::
             vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
             ::end(in_stack_ffffffffffffff98);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffffa0,
                     (__normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    paVar3 = &local_21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown exception",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<const_Catch::IExceptionTranslator_*const_*,_std::vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>_>
              ::operator*(local_10);
    (*(*ppIVar2)->_vptr_IExceptionTranslator[2])(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string tryTranslators( std::vector<const IExceptionTranslator*>::const_iterator it ) const {
            if( it == m_translators.end() )
                return "Unknown exception";

            try {
                return (*it)->translate();
            }
            catch(...) {
                return tryTranslators( it+1 );
            }
        }